

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckLOF(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  AActor *origin;
  player_t *ppVar4;
  double dVar5;
  double dVar6;
  PClass *pPVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 extraout_var;
  PClass *pPVar10;
  VMValue *pVVar11;
  AActor *other;
  subsector_t *psVar12;
  char *pcVar13;
  bool bVar14;
  undefined4 uVar15;
  double dVar16;
  double local_1a0;
  double local_190;
  double local_180;
  double local_178;
  DVector3 local_168;
  VMReturn *local_150;
  double local_148;
  void *local_140;
  ActorFlags local_134;
  DVector3 vel;
  LOFData lof_data;
  FTraceResults trace;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar13 = "(paramnum) < numparam";
LAB_003d6622:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar13 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d6622;
  }
  origin = *(AActor **)&param->field_0;
  if (origin != (AActor *)0x0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar8 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar8);
    }
    pPVar10 = (origin->super_DThinker).super_DObject.Class;
    bVar14 = pPVar10 != (PClass *)0x0;
    if (pPVar10 != pPVar7 && bVar14) {
      do {
        pPVar10 = pPVar10->ParentClass;
        bVar14 = pPVar10 != (PClass *)0x0;
        if (pPVar10 == pPVar7) break;
      } while (pPVar10 != (PClass *)0x0);
    }
    if (!bVar14) {
      pcVar13 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d6622;
    }
  }
  if (numparam == 1) {
    pVVar11 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d6660:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd7,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    pVVar11 = param;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d6660;
    }
  }
  uVar3 = pVVar11[1].field_0.i;
  if (numparam < 3) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[2].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d667f;
    }
  }
  else {
    pVVar11 = param;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d667f:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd8,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  dVar1 = pVVar11[2].field_0.f;
  if (numparam < 4) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d669e;
    }
  }
  else {
    pVVar11 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d669e:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd9,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  local_140 = pVVar11[3].field_0.field_1.a;
  if (numparam < 5) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d66bd;
    }
  }
  else {
    pVVar11 = param;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d66bd:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfda,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  local_190 = pVVar11[4].field_0.f;
  if (numparam < 6) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[5].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d66dc;
    }
  }
  else {
    pVVar11 = param;
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d66dc:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdb,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  dVar2 = pVVar11[5].field_0.f;
  if (numparam < 7) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d66fb;
    }
  }
  else {
    pVVar11 = param;
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d66fb:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdc,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  local_1a0 = pVVar11[6].field_0.f;
  if (numparam < 8) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[7].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d671a;
    }
  }
  else {
    pVVar11 = param;
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d671a:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdd,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  local_178 = pVVar11[7].field_0.f;
  if (numparam < 9) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[8].field_0.field_3.Type != '\0') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d6739;
    }
  }
  else {
    pVVar11 = param;
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar13 = "(param[paramnum]).Type == REGT_INT";
LAB_003d6739:
      __assert_fail(pcVar13,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfde,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  if (numparam < 10) {
    param = defaultparam->Array;
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar13 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d6758;
    }
  }
  else if (param[9].field_0.field_3.Type != '\x01') {
    pcVar13 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d6758:
    __assert_fail(pcVar13,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfdf,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_180 = param[9].field_0.f;
  iVar8 = 0x13;
  if (pVVar11[8].field_0.i != 0) {
    iVar8 = pVVar11[8].field_0.i;
  }
  other = COPY_AAPTR(origin,iVar8);
  if ((uVar3 >> 0x13 & 1) != 0) {
    ppVar4 = origin->player;
    if (ppVar4 == (player_t *)0x0) {
      local_1a0 = local_1a0 * origin->Height;
    }
    else {
      local_1a0 = local_1a0 * (ppVar4->mo->super_AActor).Height * ppVar4->crouchfactor;
    }
  }
  if ((uVar3 >> 0x14 & 1) != 0) {
    local_180 = local_180 * origin->radius;
    local_178 = local_178 * origin->radius;
  }
  local_168.Z = (local_1a0 - origin->Floorclip) + (origin->__Pos).Z;
  local_168.X = (origin->__Pos).X;
  local_168.Y = (origin->__Pos).Y;
  if ((uVar3 >> 0x12 & 1) == 0) {
    ppVar4 = origin->player;
    if (ppVar4 == (player_t *)0x0) {
      dVar6 = 8.0;
    }
    else {
      dVar6 = ppVar4->mo->AttackZOffset * ppVar4->crouchfactor;
    }
    local_168.Z = local_168.Z + origin->Height * 0.5 + dVar6;
  }
  if (other == (AActor *)0x0) {
    if ((uVar3 >> 0xc & 1) != 0) {
      local_190 = local_190 + (origin->Angles).Yaw.Degrees;
      dVar2 = dVar2 + (origin->Angles).Pitch.Degrees;
      local_150 = ret;
      dVar6 = FFastTrig::sin(&fasttrig,local_190 * 11930464.711111112 + 6755399441055744.0);
      dVar16 = FFastTrig::cos(&fasttrig,dVar6);
      P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,local_178 * dVar6 + local_180 * dVar16
                          ,local_180 * dVar6 - local_178 * dVar16);
      local_168.X = (double)trace.Sector;
      local_168.Y = (double)trace._8_8_;
      goto LAB_003d639e;
    }
    if (numret < 1) goto LAB_003d65d6;
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1040,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') goto LAB_003d663a;
    *(undefined4 *)ret->Location = 0;
LAB_003d65ce:
    iVar8 = 1;
  }
  else {
    if ((0.0 < dVar1) && ((uVar3 & 0x2000) == 0)) {
      dVar6 = AActor::Distance3D(origin,other,false);
      iVar8 = 0;
      if ((dVar1 < dVar6) && (iVar8 = 0, 0 < numret)) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x100f,
                        "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') goto LAB_003d663a;
        *(undefined4 *)ret->Location = 0;
        iVar8 = 1;
      }
      if (dVar1 < dVar6) {
        return iVar8;
      }
    }
    if ((uVar3 & 2) == 0) {
      local_150 = ret;
      AActor::AngleTo((AActor *)&trace,origin,SUB81(other,0));
      uVar9 = SUB84(trace.Sector,0);
      uVar15 = (undefined4)((ulong)trace.Sector >> 0x20);
    }
    else {
      dVar6 = (origin->Angles).Yaw.Degrees;
      uVar9 = SUB84(dVar6,0);
      uVar15 = (undefined4)((ulong)dVar6 >> 0x20);
      local_150 = ret;
    }
    local_190 = local_190 + (double)CONCAT44(uVar15,uVar9);
    local_148 = FFastTrig::sin(&fasttrig,
                               (double)CONCAT44(uVar15,uVar9) * 11930464.711111112 +
                               6755399441055744.0);
    dVar6 = FFastTrig::cos(&fasttrig,local_148);
    P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,
                        local_178 * local_148 + local_180 * dVar6,
                        local_180 * local_148 - local_178 * dVar6);
    local_168.X = (double)trace.Sector;
    local_168.Y = (double)trace._8_8_;
    dVar6 = AActor::Distance2D(origin,other,false);
    if ((uVar3 & 1) == 0) {
      dVar16 = (other->Height * 0.5 + (other->__Pos).Z) - local_168.Z;
      if ((uVar3 >> 0x16 & 1) != 0) {
        dVar16 = local_1a0 + dVar16;
      }
      dVar6 = c_atan2(dVar16,dVar6);
      dVar2 = dVar2 + dVar6 * -57.29577951308232;
    }
    else {
      dVar2 = dVar2 + (origin->Angles).Pitch.Degrees;
    }
LAB_003d639e:
    dVar2 = FFastTrig::cos(&fasttrig,dVar2 * 11930464.711111112 + 6755399441055744.0);
    dVar6 = FFastTrig::cos(&fasttrig,local_190 * 11930464.711111112 + 6755399441055744.0);
    dVar16 = FFastTrig::sin(&fasttrig,dVar6 * dVar2);
    dVar5 = FFastTrig::sin(&fasttrig,dVar16 * dVar2);
    vel.Z = -dVar5;
    vel.X = dVar6 * dVar2;
    vel.Y = dVar16 * dVar2;
    psVar12 = P_PointInSubsector(local_168.X,local_168.Y);
    uVar9 = SUB84(dVar1,0);
    uVar15 = (undefined4)((ulong)dVar1 >> 0x20);
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      uVar9 = (undefined4)
              *(undefined8 *)(&DAT_005fb2f0 + (ulong)(origin->player == (player_t *)0x0) * 8);
      uVar15 = (undefined4)
               ((ulong)*(undefined8 *)
                        (&DAT_005fb2f0 + (ulong)(origin->player == (player_t *)0x0) * 8) >> 0x20);
    }
    lof_data.BadActor = false;
    local_134.Value = 0xffffffff;
    lof_data.Self = origin;
    lof_data.Target = other;
    lof_data.Flags = uVar3;
    Trace(&local_168,psVar12->sector,&vel,(double)CONCAT44(uVar15,uVar9),&local_134,0x8000,origin,
          &trace,8,CheckLOFTraceFunc,&lof_data);
    if ((trace.HitType == TRACE_HitActor) ||
       ((((uVar3 >> 0x15 & 1) != 0 && (trace.HitType != TRACE_HitNone)) &&
        (lof_data.BadActor == false)))) {
      if (((double)local_140 <= 0.0) || ((double)local_140 <= trace.Distance)) {
        if ((trace.Actor != (AActor *)0x0 && trace.HitType == TRACE_HitActor) &&
           (lof_data.BadActor == false)) {
          if ((uVar3 >> 0x17 & 1) != 0) {
            (origin->target).field_0.p = trace.Actor;
          }
          if ((uVar3 >> 0x18 & 1) != 0) {
            (origin->master).field_0.p = trace.Actor;
          }
          if ((uVar3 >> 0x19 & 1) != 0) {
            (origin->tracer).field_0.p = trace.Actor;
          }
        }
        if (0 < numret) {
          if (local_150 == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x106e,
                          "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar9 = 1;
          if (local_150->RegType != '\0') goto LAB_003d663a;
          goto LAB_003d65c9;
        }
      }
      else if (0 < numret) {
        if (local_150 == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1066,
                        "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003d6554;
      }
    }
    else if (0 < numret) {
      if (local_150 == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1070,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
LAB_003d6554:
      if (local_150->RegType != '\0') {
LAB_003d663a:
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      uVar9 = 0;
LAB_003d65c9:
      *(undefined4 *)local_150->Location = uVar9;
      goto LAB_003d65ce;
    }
LAB_003d65d6:
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckLOF)
{
	// Check line of fire

	/*
		Not accounted for / I don't know how it works: FLOORCLIP
	*/

	AActor *target;
	DVector3 pos;
	DVector3 vel;

	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(range)			
	PARAM_FLOAT_DEF	(minrange)		
	PARAM_ANGLE_DEF	(angle)			
	PARAM_ANGLE_DEF	(pitch)			
	PARAM_FLOAT_DEF	(offsetheight)	
	PARAM_FLOAT_DEF	(offsetwidth)	
	PARAM_INT_DEF	(ptr_target)	
	PARAM_FLOAT_DEF	(offsetforward)	

	DAngle ang;

	target = COPY_AAPTR(self, ptr_target == AAPTR_DEFAULT ? AAPTR_TARGET|AAPTR_PLAYER_GETTARGET|AAPTR_NULL : ptr_target); // no player-support by default

	if (flags & CLOFF_MUL_HEIGHT)
	{
		if (self->player != NULL)
		{
			// Synced with hitscan: self->player->mo->height is strangely conscientious about getting the right actor for player
			offsetheight *= self->player->mo->Height * self->player->crouchfactor;
		}
		else
		{
			offsetheight *= self->Height;
		}
	}
	if (flags & CLOFF_MUL_WIDTH)
	{
		offsetforward *= self->radius;
		offsetwidth *= self->radius;
}
		
	pos = self->PosPlusZ(offsetheight - self->Floorclip);

		if (!(flags & CLOFF_FROMBASE))
		{ // default to hitscan origin

			// Synced with hitscan: self->Height is strangely NON-conscientious about getting the right actor for player
			pos.Z += self->Height *0.5;
			if (self->player != NULL)
			{
				pos.Z += self->player->mo->AttackZOffset * self->player->crouchfactor;
			}
			else
			{
				pos.Z += 8;
			}
		}

		if (target)
		{
			if (range > 0 && !(flags & CLOFF_CHECKPARTIAL))
			{
				double distance = self->Distance3D(target);
				if (distance > range)
				{
					ACTION_RETURN_BOOL(false);
				}
			}

			if (flags & CLOFF_NOAIM_HORZ)
			{
				ang = self->Angles.Yaw;
			}
			else ang = self->AngleTo (target);
				
			angle += ang;

			double s = ang.Sin();
			double c = ang.Cos();
				
			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;

			double xydist = self->Distance2D(target);
			if (flags & CLOFF_NOAIM_VERT)
			{
				pitch += self->Angles.Pitch;
			}
			else if (flags & CLOFF_AIM_VERT_NOOFFSET)
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z + offsetheight);
			}
			else
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z);
			}
		}
		else if (flags & CLOFF_ALLOWNULL)
		{
			angle += self->Angles.Yaw;
			pitch += self->Angles.Pitch;

			double s = angle.Sin();
			double c = angle.Cos();

			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;
		}
		else
		{
			ACTION_RETURN_BOOL(false);
		}

		double cp = pitch.Cos();

		vel = { cp * angle.Cos(), cp * angle.Sin(), -pitch.Sin() };

	/* Variable set:

		jump, flags, target
		pos (trace point of origin)
		vel (trace unit vector)
		range
	*/

	sector_t *sec = P_PointInSector(pos);

	if (range == 0)
	{
		range = (self->player != NULL) ? PLAYERMISSILERANGE : MISSILERANGE;
	}

	FTraceResults trace;
	LOFData lof_data;

	lof_data.Self = self;
	lof_data.Target = target;
	lof_data.Flags = flags;
	lof_data.BadActor = false;

	Trace(pos, sec, vel, range, ActorFlags::FromInt(0xFFFFFFFF), ML_BLOCKEVERYTHING, self, trace, TRACE_PortalRestrict,
		CheckLOFTraceFunc, &lof_data);

	if (trace.HitType == TRACE_HitActor ||
		((flags & CLOFF_JUMP_ON_MISS) && !lof_data.BadActor && trace.HitType != TRACE_HitNone))
	{
		if (minrange > 0 && trace.Distance < minrange)
		{
			ACTION_RETURN_BOOL(false);
		}
		if ((trace.HitType == TRACE_HitActor) && (trace.Actor != NULL) && !(lof_data.BadActor))
		{
			if (flags & (CLOFF_SETTARGET))	self->target = trace.Actor;
			if (flags & (CLOFF_SETMASTER))	self->master = trace.Actor;
			if (flags & (CLOFF_SETTRACER))	self->tracer = trace.Actor;
		}
		ACTION_RETURN_BOOL(true);
	}
	ACTION_RETURN_BOOL(false);
}